

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

bool __thiscall
tchecker::tck_reach::concur19::node_le_t::operator()(node_le_t *this,node_t *n1,node_t *n2)

{
  clockbounds_t *this_00;
  bool bVar1;
  make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *this_01;
  vloc_t *vloc;
  state_t *s1;
  state_t *s2;
  
  this_00 = (this->_clockbounds).
            super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
            ::operator*(&(n2->super_node_refzg_state_t)._state);
  vloc = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
          operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                     *)this_01)->super_vloc_t;
  clockbounds::clockbounds_t::local_lu(this_00,vloc,this->_l,this->_u);
  s1 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
        ::operator*(&(n1->super_node_refzg_state_t)._state)->super_state_t;
  s2 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
        ::operator*(&(n2->super_node_refzg_state_t)._state)->super_state_t;
  bVar1 = refzg::shared_is_sync_alu_le(s1,s2,this->_l,this->_u);
  return bVar1;
}

Assistant:

bool node_le_t::operator()(tchecker::tck_reach::concur19::node_t const & n1,
                           tchecker::tck_reach::concur19::node_t const & n2) const
{
  _clockbounds->local_lu(n2.state().vloc(), *_l, *_u);
  return tchecker::refzg::shared_is_sync_alu_le(n1.state(), n2.state(), *_l, *_u);
}